

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

bool __thiscall Qt::mightBeRichText(Qt *this,QAnyStringView text)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1String text_00;
  QVarLengthArray<char16_t,_256LL> tag;
  
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  text_00.m_data = (char *)this;
  text_00.m_size = (ulong)text.field_0.m_data & 0x3fffffffffffffff;
  bVar1 = mightBeRichTextImpl<QLatin1String>(text_00);
  return bVar1;
}

Assistant:

bool Qt::mightBeRichText(QAnyStringView text)
{
    return text.visit([](auto text) { return mightBeRichTextImpl(text); });
}